

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O3

string * __thiscall
re2::Prefilter::DebugString_abi_cxx11_(string *__return_storage_ptr__,Prefilter *this)

{
  pointer pcVar1;
  pointer ppPVar2;
  char *pcVar3;
  string *s;
  char *pcVar4;
  ulong uVar5;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [46];
  
  switch(this->op_) {
  case ALL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    pcVar4 = "";
    goto LAB_00130811;
  case NONE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "*no-matches*";
    pcVar3 = "";
LAB_00130811:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
    break;
  case ATOM:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->atom_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->atom_)._M_string_length);
    break;
  case AND:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    ppPVar2 = (this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          ppPVar2 = (this->subs_->
                    super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl
                    .super__Vector_impl_data._M_start;
        }
        if (ppPVar2[uVar5] == (Prefilter *)0x0) {
          local_1b0._0_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"<nil>","");
        }
        else {
          DebugString_abi_cxx11_((string *)local_1b0,ppPVar2[uVar5]);
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((undefined1 **)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_);
        }
        uVar5 = uVar5 + 1;
        ppPVar2 = (this->subs_->
                  super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->subs_->
                                     super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2 >>
                              3));
    }
    break;
  case OR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
    ppPVar2 = (this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->subs_->super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          ppPVar2 = (this->subs_->
                    super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl
                    .super__Vector_impl_data._M_start;
        }
        if (ppPVar2[uVar5] == (Prefilter *)0x0) {
          local_1b0._0_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"<nil>","");
        }
        else {
          DebugString_abi_cxx11_((string *)local_1b0,ppPVar2[uVar5]);
        }
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((undefined1 **)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_);
        }
        uVar5 = uVar5 + 1;
        ppPVar2 = (this->subs_->
                  super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->subs_->
                                     super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2 >>
                              3));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter.cc"
               ,0x29a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Bad op in Prefilter::DebugString: ",0x22);
    std::ostream::operator<<(local_1b0 + 8,this->op_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Prefilter::DebugString() const {
  switch (op_) {
    default:
      LOG(DFATAL) << "Bad op in Prefilter::DebugString: " << op_;
      return StringPrintf("op%d", op_);
    case NONE:
      return "*no-matches*";
    case ATOM:
      return atom_;
    case ALL:
      return "";
    case AND: {
      std::string s = "";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += " ";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      return s;
    }
    case OR: {
      std::string s = "(";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += "|";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      s += ")";
      return s;
    }
  }
}